

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

void __thiscall cmMakefile::StoreMatches(cmMakefile *this,RegularExpression *re)

{
  char *pcVar1;
  int iVar2;
  string *name;
  long lVar3;
  char nMatches [2];
  long *local_50;
  long local_48;
  long local_40 [2];
  
  lVar3 = -10;
  name = matchVariables_abi_cxx11_;
  iVar2 = 0;
  do {
    pcVar1 = (re->regmatch).endp[lVar3];
    if (pcVar1 != (char *)0x0) {
      local_50 = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,pcVar1,(re->regmatch).endp[lVar3 + 10]);
      if (local_48 != 0) {
        AddDefinition(this,name,(char *)local_50);
        cmStateSnapshot::GetDefinition(&this->StateSnapshot,name);
        iVar2 = (int)lVar3 + 0x3a;
      }
      if (local_50 != local_40) {
        operator_delete(local_50,local_40[0] + 1);
      }
    }
    name = name + 1;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0);
  local_50._0_2_ = (ushort)(byte)iVar2;
  AddDefinition(this,&nMatchesVariable_abi_cxx11_,(char *)&local_50);
  cmStateSnapshot::GetDefinition(&this->StateSnapshot,&nMatchesVariable_abi_cxx11_);
  return;
}

Assistant:

void cmMakefile::StoreMatches(cmsys::RegularExpression& re)
{
  char highest = 0;
  for (int i = 0; i < 10; i++) {
    std::string const& m = re.match(i);
    if (!m.empty()) {
      std::string const& var = matchVariables[i];
      this->AddDefinition(var, m.c_str());
      this->MarkVariableAsUsed(var);
      highest = static_cast<char>('0' + i);
    }
  }
  char nMatches[] = { highest, '\0' };
  this->AddDefinition(nMatchesVariable, nMatches);
  this->MarkVariableAsUsed(nMatchesVariable);
}